

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O3

pair<std::_List_iterator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>,_bool>
 __thiscall
wasm::InsertOrderedMap<wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>
::insert(InsertOrderedMap<wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>
         *this,pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>
               *kv)

{
  size_t *psVar1;
  _Node *p_Var2;
  _List_node_base *p_Var3;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>_>,_false,_true>,_bool>
  pVar4;
  pair<std::_List_iterator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>,_bool>
  pVar5;
  
  pVar4 = std::
          _Hashtable<wasm::Name,std::pair<wasm::Name_const,std::_List_iterator<std::pair<wasm::Name_const,std::vector<wasm::RefFunc*,std::allocator<wasm::RefFunc*>>>>>,std::allocator<std::pair<wasm::Name_const,std::_List_iterator<std::pair<wasm::Name_const,std::vector<wasm::RefFunc*,std::allocator<wasm::RefFunc*>>>>>>,std::__detail::_Select1st,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::pair<wasm::Name_const,std::_List_iterator<std::pair<wasm::Name_const,std::vector<wasm::RefFunc*,std::allocator<wasm::RefFunc*>>>>>>
                    ();
  pVar5._8_4_ = pVar4._8_4_;
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    p_Var3 = *(_List_node_base **)
              ((long)pVar4.first.
                     super__Node_iterator_base<std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>_>,_true>
                     ._M_cur.
                     super__Node_iterator_base<std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>_>,_true>
              + 0x18);
  }
  else {
    p_Var2 = std::__cxx11::
             list<std::pair<wasm::Name_const,std::vector<wasm::RefFunc*,std::allocator<wasm::RefFunc*>>>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::RefFunc*,std::allocator<wasm::RefFunc*>>>>>
             ::
             _M_create_node<std::pair<wasm::Name_const,std::vector<wasm::RefFunc*,std::allocator<wasm::RefFunc*>>>const&>
                       ((list<std::pair<wasm::Name_const,std::vector<wasm::RefFunc*,std::allocator<wasm::RefFunc*>>>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::RefFunc*,std::allocator<wasm::RefFunc*>>>>>
                         *)&this->List,kv);
    std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
    psVar1 = &(this->List).
              super__List_base<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    p_Var3 = (this->List).
             super__List_base<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
    *(_List_node_base **)
     ((long)pVar4.first.
            super__Node_iterator_base<std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>_>,_true>
            ._M_cur.
            super__Node_iterator_base<std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_std::vector<wasm::RefFunc_*,_std::allocator<wasm::RefFunc_*>_>_>_>_>,_true>
     + 0x18) = p_Var3;
  }
  pVar5.first._M_node = p_Var3;
  pVar5._12_4_ = 0;
  return pVar5;
}

Assistant:

std::pair<iterator, bool> insert(const std::pair<const Key, T>& kv) {
    // Try inserting with a placeholder list iterator.
    auto inserted = Map.insert({kv.first, List.end()});
    if (inserted.second) {
      // This is a new item; insert it in the list and update the iterator.
      List.push_back(kv);
      inserted.first->second = std::prev(List.end());
    }
    return {inserted.first->second, inserted.second};
  }